

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

sensor * __thiscall ev3dev::sensor::set_mode(sensor *this,string *v)

{
  sensor *in_RDI;
  string *in_stack_00000070;
  string *in_stack_00000078;
  device *in_stack_00000080;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"mode",&local_31);
  device::set_attr_string(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

sensor& set_mode(std::string v) {
            set_attr_string("mode", v);
            return *this;
        }